

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  sqlite3 *db;
  Db *pDVar3;
  Btree *p;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  Db *pDVar10;
  bool bVar11;
  bool bVar12;
  char zErr [128];
  char acStack_b8 [136];
  
  pcVar4 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar7 = "";
  if (pcVar4 != (char *)0x0) {
    pcVar7 = pcVar4;
  }
  db = context->pOut->db;
  uVar5 = db->nDb;
  uVar6 = (ulong)(int)uVar5;
  bVar11 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    pDVar3 = db->aDb;
    pDVar10 = pDVar3 + (uVar5 - 1);
    uVar8 = 0;
LAB_001bb757:
    if (pDVar3[uVar8].pBt != (Btree *)0x0) {
      lVar9 = 0;
      do {
        bVar1 = pDVar3[uVar8].zDbSName[lVar9];
        bVar2 = pcVar7[lVar9];
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) goto LAB_001bb795;
        }
        else if (""[bVar1] != ""[bVar2]) goto LAB_001bb795;
        lVar9 = lVar9 + 1;
      } while( true );
    }
    goto LAB_001bb79a;
  }
  pDVar10 = (Db *)0x0;
  bVar12 = true;
LAB_001bb7bc:
  pcVar7 = "no such database: %s";
  if ((bVar11) && (pcVar7 = "cannot detach database %s", !bVar12)) {
    p = pDVar10->pBt;
    pcVar7 = "database %s is locked";
    if ((p->inTrans == '\0') && (p->nBackup == 0)) {
      sqlite3BtreeClose(p);
      pDVar10->pBt = (Btree *)0x0;
      pDVar10->pSchema = (Schema *)0x0;
      sqlite3CollapseDatabaseArray(db);
      return;
    }
  }
  sqlite3_snprintf(0x80,acStack_b8,pcVar7);
  context->isError = 1;
  sqlite3VdbeMemSetStr(context->pOut,acStack_b8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
  ;
  return;
LAB_001bb795:
  if (bVar1 == bVar2) {
    uVar5 = (uint)uVar8;
    pDVar10 = pDVar3 + uVar8;
    goto LAB_001bb7b5;
  }
LAB_001bb79a:
  uVar8 = uVar8 + 1;
  bVar11 = uVar8 < uVar6;
  if (uVar8 == uVar6) goto LAB_001bb7b5;
  goto LAB_001bb757;
LAB_001bb7b5:
  bVar12 = uVar5 < 2;
  goto LAB_001bb7bc;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}